

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u8 read_u8(Emulator *e,Address addr)

{
  Bool BVar1;
  MemoryTypeAddressPair pair;
  u8 value;
  u32 rom_addr;
  u32 bank;
  Address addr_local;
  Emulator *e_local;
  
  dma_synchronize(e);
  BVar1 = is_dma_access_ok(e,addr);
  if (BVar1 == FALSE) {
    e_local._7_1_ = 0xff;
  }
  else if (addr < 0x8000) {
    e_local._7_1_ =
         e->cart_info->data
         [(e->state).memory_map_state.rom_base[(uint)((int)(uint)addr >> 0xe)] | addr & 0x3fff];
  }
  else {
    pair = map_address(addr);
    e_local._7_1_ = read_u8_pair(e,pair,FALSE);
  }
  return e_local._7_1_;
}

Assistant:

static u8 read_u8(Emulator* e, Address addr) {
  dma_synchronize(e);
  if (UNLIKELY(!is_dma_access_ok(e, addr))) {
    HOOK(read_during_dma_a, addr);
    return INVALID_READ_BYTE;
  }
  if (LIKELY(addr < 0x8000)) {
    u32 bank = addr >> ROM_BANK_SHIFT;
    u32 rom_addr = MMAP_STATE.rom_base[bank] | (addr & ADDR_MASK_16K);
    u8 value = e->cart_info->data[rom_addr];
    HOOK(read_rom_ib, rom_addr, value);
    return value;
  } else {
    return read_u8_pair(e, map_address(addr), FALSE);
  }
}